

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_bind_parameter_count(sqlite3_stmt *pStmt)

{
  bool bVar1;
  size_type sVar2;
  pointer pPVar3;
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
  *in_RDI;
  int local_4;
  
  if (in_RDI == (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                 *)0x0) {
    local_4 = 0;
  }
  else {
    bVar1 = std::
            unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>::
            operator_bool((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                           *)0x29ff9f9);
    if (bVar1) {
      duckdb::
      unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
      operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                  *)in_RDI);
      sVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)0x29ffa1c);
      local_4 = (int)sVar2;
    }
    else {
      bVar1 = std::
              unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
              ::operator_bool((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
                               *)0x29ffa30);
      if (bVar1) {
        pPVar3 = duckdb::
                 unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                 ::operator->(in_RDI);
        local_4 = (int)(pPVar3->super_BaseQueryResult).properties.parameter_count;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int sqlite3_bind_parameter_count(sqlite3_stmt *pStmt) {
	if (!pStmt) {
		return 0;
	}
	if (pStmt->prepared) {
		return (int)pStmt->prepared->named_param_map.size();
	}
	if (pStmt->pending) {
		return (int)pStmt->pending->properties.parameter_count;
	}
	return 0;
}